

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O3

void helper_gvec_sar64i_ppc64(void *d,void *a,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = desc * 8 & 0xff;
  uVar2 = 0;
  do {
    *(long *)((long)d + uVar2) = *(long *)((long)a + uVar2) >> ((byte)((int)desc >> 10) & 0x3f);
    uVar2 = uVar2 + 8;
  } while (uVar2 < uVar1 + 8);
  if ((desc >> 2 & 0xf8) <= uVar1) {
    return;
  }
  helper_gvec_sar64i_ppc64_cold_1();
  return;
}

Assistant:

void HELPER(gvec_sar64i)(void *d, void *a, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    int shift = simd_data(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint64_t)) {
        *(int64_t *)((char *)d + i) = *(int64_t *)((char *)a + i) >> shift;
    }
    clear_high(d, oprsz, desc);
}